

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_Pair_resizeT(ImVector_Pair *self,int new_size,Pair v)

{
  int new_size_local;
  ImVector_Pair *self_local;
  Pair v_local;
  
  v_local._0_8_ = v.field_1;
  self_local._0_4_ = v.key;
  ImVector<ImGuiStorage::ImGuiStoragePair>::resize(self,new_size,(ImGuiStoragePair *)&self_local);
  return;
}

Assistant:

CIMGUI_API void ImVector_Pair_resizeT(ImVector_Pair* self,int new_size,const Pair v)
{
    return self->resize(new_size,v);
}